

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MeshPointOrigin::MeshPointOrigin
          (MeshPointOrigin *this,string *name,int priority,string *description)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this->m_priority = priority;
  return;
}

Assistant:

MeshPointOrigin(const std::string& name, int priority, const std::string& description) : m_name(name), m_description(description), m_priority(priority){}